

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O1

void xSAT_SolverRebuildOrderHeap(xSAT_Solver_t *s)

{
  uint uVar1;
  xSAT_Heap_t *h;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Str_t *pVVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = s->vAssigns->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar6 = iVar7;
  }
  p->nSize = 0;
  p->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  p->pArray = piVar4;
  pVVar5 = s->vAssigns;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      if (pVVar5->pArray[lVar8] == '\x03') {
        Vec_IntPush(p,(int)lVar8);
      }
      lVar8 = lVar8 + 1;
      pVVar5 = s->vAssigns;
    } while (lVar8 < pVVar5->nSize);
  }
  h = s->hOrder;
  pVVar2 = h->vHeap;
  if (0 < pVVar2->nSize) {
    piVar4 = pVVar2->pArray;
    pVVar3 = h->vIndices;
    lVar8 = 0;
    do {
      iVar7 = piVar4[lVar8];
      if (((long)iVar7 < 0) || (pVVar3->nSize <= iVar7)) goto LAB_008f81b2;
      pVVar3->pArray[iVar7] = -1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar2->nSize);
  }
  pVVar2->nSize = 0;
  iVar7 = p->nSize;
  if (0 < (long)iVar7) {
    piVar4 = p->pArray;
    lVar8 = 0;
    do {
      iVar6 = piVar4[lVar8];
      if (((long)iVar6 < 0) || (h->vIndices->nSize <= iVar6)) {
LAB_008f81b2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      h->vIndices->pArray[iVar6] = (int)lVar8;
      Vec_IntPush(h->vHeap,iVar6);
      lVar8 = lVar8 + 1;
    } while (iVar7 != lVar8);
  }
  uVar1 = h->vHeap->nSize;
  if (1 < (int)uVar1) {
    iVar7 = (uVar1 >> 1) + 1;
    do {
      xSAT_HeapPercolateDown(h,iVar7 + -2);
      iVar7 = iVar7 + -1;
    } while (1 < iVar7);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return;
}

Assistant:

void xSAT_SolverRebuildOrderHeap( xSAT_Solver_t * s )
{
    Vec_Int_t * vTemp = Vec_IntAlloc( Vec_StrSize( s->vAssigns ) );
    int Var;

    for ( Var = 0; Var < Vec_StrSize( s->vAssigns ); Var++ )
        if ( Vec_StrEntry( s->vAssigns, Var ) == VarX )
            Vec_IntPush( vTemp, Var );

    xSAT_HeapBuild( s->hOrder, vTemp );
    Vec_IntFree( vTemp );
}